

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

Float __thiscall
pbrt::IdealDiffuseBxDF::PDF
          (IdealDiffuseBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  bool bVar1;
  int iVar2;
  BxDFReflTransFlags in_EDX;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  Tuple3<pbrt::Vector3,_float> local_2c;
  Tuple3<pbrt::Vector3,_float> local_20;
  Tuple3<pbrt::Vector3,_float> local_10;
  float local_4;
  
  local_20._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_2c._0_8_ = vmovlpd_avx(in_XMM2);
  local_10._0_8_ = local_20._0_8_;
  iVar2 = operator&(in_EDX,Reflection);
  if (iVar2 == 0) {
    local_4 = 0.0;
  }
  else {
    bVar1 = SameHemisphere((Vector3f *)&local_10,(Vector3f *)&local_2c);
    if (bVar1) {
      FVar3 = AbsCosTheta((Vector3f *)0x7f524b);
      local_4 = FVar3 * 0.31830987;
    }
    else {
      local_4 = 0.0;
    }
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (SameHemisphere(wo, wi))
            return AbsCosTheta(wi) * InvPi;
        else
            return 0;
    }